

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall
TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_>::Resize
          (TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_> *this,
          hash_t nhsize)

{
  Node *block;
  Node *pNVar1;
  ulong uVar2;
  MapinfoSpawnItem *pMVar3;
  bool bVar4;
  
  uVar2 = (ulong)this->Size;
  block = this->Nodes;
  SetNodeVector(this,nhsize);
  this->NumUsed = 0;
  pMVar3 = &(block->Pair).Value;
  while (bVar4 = uVar2 != 0, uVar2 = uVar2 - 1, bVar4) {
    if (pMVar3[-1].filename.Chars != (char *)0x1) {
      pNVar1 = NewKey(this,pMVar3[-1].linenum);
      MapinfoSpawnItem::MapinfoSpawnItem(&(pNVar1->Pair).Value,pMVar3);
      FString::~FString(&pMVar3->filename);
    }
    pMVar3 = (MapinfoSpawnItem *)&pMVar3[1].linenum;
  }
  M_Free(block);
  return;
}

Assistant:

void Resize(hash_t nhsize)
	{
		hash_t i, oldhsize = Size;
		Node *nold = Nodes;
		/* create new hash part with appropriate size */
		SetNodeVector(nhsize);
		/* re-insert elements from hash part */
		NumUsed = 0;
		for (i = 0; i < oldhsize; ++i)
		{
			if (!nold[i].IsNil())
			{
				Node *n = NewKey(nold[i].Pair.Key);
				::new(&n->Pair.Value) VT(nold[i].Pair.Value);
				nold[i].~Node();
			}
		}
		M_Free(nold);
	}